

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::SetCommonFieldVariables
          (FieldGeneratorBase *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *variables)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  uint32 uVar1;
  int iVar2;
  pointer pcVar3;
  bool bVar4;
  uint uVar5;
  char *pcVar6;
  long *plVar7;
  mapped_type *pmVar8;
  undefined8 *puVar9;
  byte *pbVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  size_type *psVar15;
  uint uVar16;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *pFVar17;
  Descriptor *extraout_RDX_01;
  Descriptor *extraout_RDX_02;
  Descriptor *extraout_RDX_03;
  Descriptor *descriptor;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  once_flag *__once;
  _Alloc_hider _Var23;
  ulong uVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  FieldDescriptor *pFVar26;
  FieldGeneratorBase *pFVar27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string hasBitsMask;
  uint8 tag_array [5];
  string tag_bytes;
  key_type local_170;
  key_type local_150;
  key_type local_120;
  byte local_fd [5];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_f8;
  FieldDescriptor *local_f0 [2];
  FieldDescriptor local_e0 [16];
  key_type local_d0;
  uint local_ac;
  key_type local_a8;
  uint local_84;
  FieldGeneratorBase *local_80;
  key_type local_78;
  uint local_54;
  key_type local_50;
  
  pFVar17 = this->descriptor_;
  iVar2 = *(int *)(pFVar17 + 4);
  local_f8 = variables;
  local_80 = this;
  if (*(once_flag **)(pFVar17 + 0x18) == (once_flag *)0x0) {
    __once = (once_flag *)0x0;
    pFVar26 = pFVar17;
  }
  else {
    local_150._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_f0[0] = pFVar17;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar17 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_150,
               local_f0);
    __once = *(once_flag **)(this->descriptor_ + 0x18);
    pFVar26 = this->descriptor_;
  }
  pFVar27 = local_80;
  uVar19 = iVar2 * 8 + 1;
  iVar2 = 0x1f;
  if (uVar19 != 0) {
    for (; uVar19 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  uVar19 = (iVar2 * 9 + 0x49U >> 6) << (pFVar17[2] == (FieldDescriptor)0xa);
  pFVar17 = pFVar26;
  if (__once != (once_flag *)0x0) {
    local_150._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_f0[0] = pFVar26;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (__once,(_func_void_FieldDescriptor_ptr **)&local_150,local_f0);
    pFVar17 = pFVar27->descriptor_;
  }
  uVar20 = uVar19 >> (pFVar26[2] == (FieldDescriptor)0xa);
  iVar2 = *(int *)(pFVar17 + 4);
  local_54 = uVar19;
  bVar4 = FieldDescriptor::is_packed(pFVar17);
  uVar19 = 2;
  if (!bVar4) {
    if (*(once_flag **)(pFVar17 + 0x18) != (once_flag *)0x0) {
      local_150._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_f0[0] = pFVar17;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar17 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_150,
                 local_f0);
    }
    uVar19 = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)(byte)pFVar17[2] * 4
                      );
  }
  uVar19 = iVar2 << 3 | uVar19;
  local_fd[0] = (byte)uVar19;
  if (0x7f < uVar19) {
    local_fd[0] = local_fd[0] | 0x80;
    uVar5 = uVar19 >> 7;
    local_fd[1] = (byte)uVar5;
    if (0x3fff < uVar19) {
      pbVar10 = local_fd + 2;
      uVar16 = uVar5 & 0xff;
      do {
        pbVar10[-1] = (byte)uVar16 | 0x80;
        uVar16 = uVar5 >> 7;
        *pbVar10 = (byte)uVar16;
        pbVar10 = pbVar10 + 1;
        bVar4 = 0x3fff < uVar5;
        uVar5 = uVar16;
      } while (bVar4);
    }
  }
  paVar11 = &local_150.field_2;
  local_150._M_dataplus._M_p = (pointer)paVar11;
  local_ac = uVar19;
  pcVar6 = FastInt32ToBufferLeft((uint)local_fd[0],paVar11->_M_local_buf);
  local_150._M_string_length = (long)pcVar6 - (long)paVar11;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,local_150._M_dataplus._M_p,
             local_150._M_dataplus._M_p + local_150._M_string_length);
  local_84 = uVar20;
  if (1 < uVar20) {
    uVar21 = 1;
    do {
      paVar11 = &local_150.field_2;
      local_150._M_dataplus._M_p = (pointer)paVar11;
      pcVar6 = FastInt32ToBufferLeft((uint)local_fd[uVar21],paVar11->_M_local_buf);
      local_150._M_string_length = (long)pcVar6 - (long)paVar11;
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,local_150._M_dataplus._M_p,
                 local_150._M_dataplus._M_p + local_150._M_string_length);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,0x3fec15);
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar11) {
        local_170.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_170.field_2._8_8_ = plVar7[3];
      }
      else {
        local_170.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_170._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_170._M_string_length = plVar7[1];
      *plVar7 = (long)paVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_f0,(ulong)local_170._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      uVar21 = uVar21 + 1;
    } while (uVar20 != uVar21);
  }
  paVar11 = &local_150.field_2;
  local_150._M_dataplus._M_p = (pointer)paVar11;
  pcVar6 = FastUInt32ToBufferLeft(local_ac,paVar11->_M_local_buf);
  paVar25 = &local_170.field_2;
  local_150._M_string_length = (long)pcVar6 - (long)paVar11;
  local_170._M_dataplus._M_p = (pointer)paVar25;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,local_150._M_dataplus._M_p,
             local_150._M_dataplus._M_p + local_150._M_string_length);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"tag","");
  pmVar18 = local_f8;
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_f8,&local_120);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_170);
  pFVar27 = local_80;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar25) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  local_150._M_dataplus._M_p = (pointer)paVar11;
  pcVar6 = FastInt32ToBufferLeft(local_54,paVar11->_M_local_buf);
  local_150._M_string_length = (long)pcVar6 - (long)paVar11;
  local_170._M_dataplus._M_p = (pointer)paVar25;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,local_150._M_dataplus._M_p,
             local_150._M_dataplus._M_p + local_150._M_string_length);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"tag_size","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar18,&local_120);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar25) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  local_150._M_dataplus._M_p = (pointer)paVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"tag_bytes","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar18,&local_150);
  std::__cxx11::string::_M_assign((string *)pmVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar11) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pFVar27->descriptor_;
  if (*(once_flag **)(paVar11->_M_local_buf + 0x18) != (once_flag *)0x0) {
    local_150._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_170._M_dataplus._M_p = (pointer)paVar11;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(paVar11->_M_local_buf + 0x18),
               (_func_void_FieldDescriptor_ptr **)&local_150,(FieldDescriptor **)&local_170);
  }
  pmVar18 = local_f8;
  if (paVar11->_M_local_buf[2] == '\n') {
    uVar1 = *(int *)(pFVar27->descriptor_ + 4) * 8 + 4;
    uVar19 = *(int *)(pFVar27->descriptor_ + 4) << 3;
    local_fd[0] = (byte)uVar1;
    if (0x7f < uVar19) {
      local_fd[0] = local_fd[0] | 0x80;
      uVar20 = uVar19 >> 7;
      local_fd[1] = (byte)uVar20;
      if (0x3fff < uVar19) {
        pbVar10 = local_fd + 2;
        uVar19 = uVar20 & 0xff;
        do {
          pbVar10[-1] = (byte)uVar19 | 0x80;
          uVar19 = uVar20 >> 7;
          *pbVar10 = (byte)uVar19;
          pbVar10 = pbVar10 + 1;
          bVar4 = 0x3fff < uVar20;
          uVar20 = uVar19;
        } while (bVar4);
      }
    }
    paVar11 = &local_150.field_2;
    local_150._M_dataplus._M_p = (pointer)paVar11;
    pcVar6 = FastInt32ToBufferLeft((uint)local_fd[0],paVar11->_M_local_buf);
    local_150._M_string_length = (long)pcVar6 - (long)paVar11;
    local_170._M_dataplus._M_p = (pointer)paVar25;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,local_150._M_dataplus._M_p,
               local_150._M_dataplus._M_p + local_150._M_string_length);
    std::__cxx11::string::operator=((string *)local_f0,(string *)&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar25) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    local_ac = uVar1;
    if (1 < local_84) {
      uVar21 = (ulong)local_84;
      uVar24 = 1;
      do {
        paVar11 = &local_150.field_2;
        local_150._M_dataplus._M_p = (pointer)paVar11;
        pcVar6 = FastInt32ToBufferLeft((uint)local_fd[uVar24],paVar11->_M_local_buf);
        local_150._M_string_length = (long)pcVar6 - (long)paVar11;
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_120,local_150._M_dataplus._M_p,
                   local_150._M_dataplus._M_p + local_150._M_string_length);
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,0x3fec15);
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar11) {
          local_170.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_170.field_2._8_8_ = puVar9[3];
        }
        else {
          local_170.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_170._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_170._M_string_length = puVar9[1];
        *puVar9 = paVar11;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_f0,(ulong)local_170._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p);
        }
        uVar24 = uVar24 + 1;
      } while (uVar21 != uVar24);
    }
    paVar11 = &local_150.field_2;
    local_150._M_dataplus._M_p = (pointer)paVar11;
    pcVar6 = FastUInt32ToBufferLeft(local_ac,paVar11->_M_local_buf);
    local_150._M_string_length = (long)pcVar6 - (long)paVar11;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,local_150._M_dataplus._M_p,
               local_150._M_dataplus._M_p + local_150._M_string_length);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"end_tag","");
    pFVar27 = local_80;
    pmVar18 = local_f8;
    this_00 = &local_80->variables_;
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_120);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    local_150._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"end_tag_bytes","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_150);
    std::__cxx11::string::_M_assign((string *)pmVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar11) {
      operator_delete(local_150._M_dataplus._M_p);
    }
  }
  paVar25 = &local_170.field_2;
  paVar11 = &local_150.field_2;
  local_150._M_dataplus._M_p = (pointer)paVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"access_level","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar18,&local_150);
  std::__cxx11::string::_M_replace((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,0x40173d);
  pFVar17 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar11) {
    operator_delete(local_150._M_dataplus._M_p);
    pFVar17 = extraout_RDX_00;
  }
  GetPropertyName_abi_cxx11_(&local_150,(csharp *)pFVar27->descriptor_,pFVar17);
  local_170._M_dataplus._M_p = (pointer)paVar25;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"property_name","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar18,&local_170);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar25) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar11) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  type_name_abi_cxx11_(&local_150,pFVar27,pFVar27->descriptor_);
  local_170._M_dataplus._M_p = (pointer)paVar25;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"type_name","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar18,&local_170);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
  descriptor = extraout_RDX_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar25) {
    operator_delete(local_170._M_dataplus._M_p);
    descriptor = extraout_RDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar11) {
    operator_delete(local_150._M_dataplus._M_p);
    descriptor = extraout_RDX_03;
  }
  GetClassName_abi_cxx11_(&local_150,*(csharp **)(pFVar27->descriptor_ + 0x20),descriptor);
  local_170._M_dataplus._M_p = (pointer)paVar25;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"extended_type","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar18,&local_170);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar25) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar11) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  name_abi_cxx11_(&local_150,pFVar27);
  local_170._M_dataplus._M_p = (pointer)paVar25;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"name","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar18,&local_170);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar25) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar11) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_150._M_dataplus._M_p = (pointer)paVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"descriptor_name","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar18,&local_150);
  std::__cxx11::string::_M_assign((string *)pmVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar11) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  default_value_abi_cxx11_(&local_150,pFVar27,pFVar27->descriptor_);
  local_170._M_dataplus._M_p = (pointer)paVar25;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"default_value","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar18,&local_170);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar25) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar11) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  capitalized_type_name_abi_cxx11_(&local_150,pFVar27);
  local_170._M_dataplus._M_p = (pointer)paVar25;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"capitalized_type_name","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar18,&local_170);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar25) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar11) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  number_abi_cxx11_(&local_150,pFVar27);
  local_170._M_dataplus._M_p = (pointer)paVar25;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"number","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar18,&local_170);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar25) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar11) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  bVar4 = has_default_value(pFVar27);
  if (bVar4) {
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pFVar27->descriptor_;
    if ((~paVar12->_M_local_buf[1] & 0x60U) != 0) {
      if (*(once_flag **)(paVar12->_M_local_buf + 0x18) != (once_flag *)0x0) {
        local_150._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
        local_170._M_dataplus._M_p = (pointer)paVar12;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(paVar12->_M_local_buf + 0x18),
                   (_func_void_FieldDescriptor_ptr **)&local_150,(FieldDescriptor **)&local_170);
      }
      if ((paVar12->_M_local_buf[2] != '\v') &&
         ((*(char *)(*(long *)(paVar12->_M_local_buf + 0x10) + 0x3a) == '\x02' ||
          ((paVar12->_M_local_buf[1] & 2U) != 0)))) goto LAB_002bbd14;
    }
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"name","");
    pmVar18 = local_f8;
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_f8,&local_120);
    pcVar3 = (pmVar8->_M_dataplus)._M_p;
    local_170._M_dataplus._M_p = (pointer)paVar25;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,pcVar3,pcVar3 + pmVar8->_M_string_length);
    std::__cxx11::string::append((char *)&local_170);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"default_value","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar18,&local_d0);
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_170,(ulong)(pmVar8->_M_dataplus)._M_p);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar12) {
      local_150.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_150.field_2._8_4_ = (undefined4)plVar7[3];
      local_150.field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
      local_150._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_150.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_150._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_150._M_string_length = plVar7[1];
    *plVar7 = (long)paVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"name_def_message","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_f8,&local_a8);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar11) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    pFVar27 = local_80;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar25) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    _Var23._M_p = local_120._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
LAB_002bbdd3:
      operator_delete(_Var23._M_p);
    }
  }
  else {
LAB_002bbd14:
    local_170._M_dataplus._M_p = (pointer)paVar25;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"name","");
    pmVar18 = local_f8;
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_f8,&local_170);
    pcVar3 = (pmVar8->_M_dataplus)._M_p;
    local_150._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar3,pcVar3 + pmVar8->_M_string_length);
    std::__cxx11::string::append((char *)&local_150);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"name_def_message","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar18,&local_120);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar11) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    _Var23._M_p = local_170._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar25) goto LAB_002bbdd3;
  }
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pFVar27->descriptor_;
  if ((~paVar12->_M_local_buf[1] & 0x60U) == 0) {
LAB_002bbe14:
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"property_name","");
    pmVar18 = local_f8;
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_f8,&local_120);
    pcVar3 = (pmVar8->_M_dataplus)._M_p;
    local_170._M_dataplus._M_p = (pointer)paVar25;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,pcVar3,pcVar3 + pmVar8->_M_string_length);
    std::__cxx11::string::append((char *)&local_170);
    paVar12 = &local_d0.field_2;
    local_d0._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"default_value","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar18,&local_d0);
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_170,(ulong)(pmVar8->_M_dataplus)._M_p);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar13) {
      local_150.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_150.field_2._8_4_ = (undefined4)plVar7[3];
      local_150.field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
      local_150._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_150.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_150._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_150._M_string_length = plVar7[1];
    *plVar7 = (long)paVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    paVar13 = &local_a8.field_2;
    local_a8._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"has_property_check","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar18,&local_a8);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar13) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar11) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar12) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar25) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    local_d0._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"property_name","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar18,&local_d0);
    std::operator+(&local_120,"other.",pmVar8);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar14) {
      local_170.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_170.field_2._8_8_ = puVar9[3];
      local_170._M_dataplus._M_p = (pointer)paVar25;
    }
    else {
      local_170.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_170._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_170._M_string_length = puVar9[1];
    *puVar9 = paVar14;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    local_a8._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"default_value","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar18,&local_a8);
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_170,(ulong)(pmVar8->_M_dataplus)._M_p);
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar14) {
      local_150.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_150.field_2._8_4_ = *(undefined4 *)(puVar9 + 3);
      local_150.field_2._12_4_ = *(undefined4 *)((long)puVar9 + 0x1c);
      local_150._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_150.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_150._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_150._M_string_length = puVar9[1];
    *puVar9 = paVar14;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"other_has_property_check","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_f8,&local_78);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar11) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar13) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar25) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    _Var23._M_p = local_d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == paVar12) goto LAB_002bc15e;
  }
  else {
    if (*(once_flag **)(paVar12->_M_local_buf + 0x18) != (once_flag *)0x0) {
      local_150._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_170._M_dataplus._M_p = (pointer)paVar12;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(paVar12->_M_local_buf + 0x18),
                 (_func_void_FieldDescriptor_ptr **)&local_150,(FieldDescriptor **)&local_170);
    }
    if ((paVar12->_M_local_buf[2] == '\v') ||
       ((*(char *)(*(long *)(paVar12->_M_local_buf + 0x10) + 0x3a) != '\x02' &&
        ((paVar12->_M_local_buf[1] & 2U) == 0)))) goto LAB_002bbe14;
    local_170._M_dataplus._M_p = (pointer)paVar25;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"property_name","");
    pmVar18 = local_f8;
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_f8,&local_170);
    std::operator+(&local_150,"Has",pmVar8);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"has_property_check","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar18,&local_120);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar11) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar25) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    local_170._M_dataplus._M_p = (pointer)paVar25;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"property_name","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar18,&local_170);
    std::operator+(&local_150,"other.Has",pmVar8);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"other_has_property_check","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar18,&local_120);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar11) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar25) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    local_170._M_dataplus._M_p = (pointer)paVar25;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"has_property_check","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar18,&local_170);
    std::operator+(&local_150,"!",pmVar8);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"has_not_property_check","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar18,&local_120);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar11) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar25) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    local_170._M_dataplus._M_p = (pointer)paVar25;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"other_has_property_check","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar18,&local_170);
    std::operator+(&local_150,"!",pmVar8);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"other_has_not_property_check","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar18,&local_120);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar11) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar25) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    iVar2 = pFVar27->presenceIndex_;
    if (iVar2 == -1) goto LAB_002bc15e;
    iVar22 = iVar2 + 0x1f;
    if (-1 < iVar2) {
      iVar22 = iVar2;
    }
    local_150._M_dataplus._M_p = (pointer)paVar11;
    pcVar6 = FastInt32ToBufferLeft(iVar22 >> 5,paVar11->_M_local_buf);
    local_150._M_string_length = (long)pcVar6 - (long)paVar11;
    local_170._M_dataplus._M_p = (pointer)paVar25;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,local_150._M_dataplus._M_p,
               local_150._M_dataplus._M_p + local_150._M_string_length);
    local_150._M_dataplus._M_p = (pointer)paVar11;
    pcVar6 = FastInt32ToBufferLeft
                       (1 << ((byte)pFVar27->presenceIndex_ & 0x1f),paVar11->_M_local_buf);
    local_150._M_string_length = (long)pcVar6 - (long)paVar11;
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,local_150._M_dataplus._M_p,
               local_150._M_dataplus._M_p + local_150._M_string_length);
    std::operator+(&local_78,"(_hasBits",&local_170);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_78);
    paVar25 = &local_a8.field_2;
    psVar15 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_a8.field_2._M_allocated_capacity = *psVar15;
      local_a8.field_2._8_8_ = plVar7[3];
      local_a8._M_dataplus._M_p = (pointer)paVar25;
    }
    else {
      local_a8.field_2._M_allocated_capacity = *psVar15;
      local_a8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_a8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar15;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_a8,(ulong)local_120._M_dataplus._M_p);
    paVar12 = &local_d0.field_2;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar13) {
      local_d0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_d0.field_2._8_8_ = plVar7[3];
      local_d0._M_dataplus._M_p = (pointer)paVar12;
    }
    else {
      local_d0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_d0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_d0._M_string_length = plVar7[1];
    *plVar7 = (long)paVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar13) {
      local_150.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_150.field_2._8_4_ = (undefined4)plVar7[3];
      local_150.field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
      local_150._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_150.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_150._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_150._M_string_length = plVar7[1];
    *plVar7 = (long)paVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"has_field_check","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_f8,&local_50);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    pmVar18 = local_f8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar11) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar12) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar25) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    paVar13 = &local_78.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar13) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    std::operator+(&local_a8,"_hasBits",&local_170);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar14) {
      local_d0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_d0.field_2._8_8_ = plVar7[3];
      local_d0._M_dataplus._M_p = (pointer)paVar12;
    }
    else {
      local_d0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_d0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_d0._M_string_length = plVar7[1];
    *plVar7 = (long)paVar14;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_d0,(ulong)local_120._M_dataplus._M_p);
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar14) {
      local_150.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_150.field_2._8_4_ = (undefined4)plVar7[3];
      local_150.field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
      local_150._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_150.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_150._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_150._M_string_length = plVar7[1];
    *plVar7 = (long)paVar14;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_78._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"set_has_field","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar18,&local_78);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar13) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar11) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar12) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar25) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    std::operator+(&local_a8,"_hasBits",&local_170);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar14) {
      local_d0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_d0.field_2._8_8_ = puVar9[3];
      local_d0._M_dataplus._M_p = (pointer)paVar12;
    }
    else {
      local_d0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_d0._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_d0._M_string_length = puVar9[1];
    *puVar9 = paVar14;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_120._M_dataplus._M_p);
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar14) {
      local_150.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_150.field_2._8_4_ = *(undefined4 *)(puVar9 + 3);
      local_150.field_2._12_4_ = *(undefined4 *)((long)puVar9 + 0x1c);
      local_150._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_150.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_150._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_150._M_string_length = puVar9[1];
    *puVar9 = paVar14;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    local_78._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"clear_has_field","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar18,&local_78);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar13) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar11) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar12) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar25) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    _Var23._M_p = local_170._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p == &local_170.field_2) goto LAB_002bc15e;
  }
  operator_delete(_Var23._M_p);
LAB_002bc15e:
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0]);
  }
  return;
}

Assistant:

void FieldGeneratorBase::SetCommonFieldVariables(
    std::map<std::string, std::string>* variables) {
  // Note: this will be valid even though the tag emitted for packed and unpacked versions of
  // repeated fields varies by wire format. The wire format is encoded in the bottom 3 bits, which
  // never effects the tag size.
  int tag_size = internal::WireFormat::TagSize(descriptor_->number(), descriptor_->type());
  int part_tag_size = tag_size;
  if (descriptor_->type() == FieldDescriptor::TYPE_GROUP) {
    part_tag_size /= 2;
  }
  uint tag = internal::WireFormat::MakeTag(descriptor_);
  uint8 tag_array[5];
  io::CodedOutputStream::WriteTagToArray(tag, tag_array);
  std::string tag_bytes = StrCat(tag_array[0]);
  for (int i = 1; i < part_tag_size; i++) {
    tag_bytes += ", " + StrCat(tag_array[i]);
  }

  (*variables)["tag"] = StrCat(tag);
  (*variables)["tag_size"] = StrCat(tag_size);
  (*variables)["tag_bytes"] = tag_bytes;

  if (descriptor_->type() == FieldDescriptor::Type::TYPE_GROUP) {
    tag = internal::WireFormatLite::MakeTag(
        descriptor_->number(),
        internal::WireFormatLite::WIRETYPE_END_GROUP);
    io::CodedOutputStream::WriteTagToArray(tag, tag_array);
    tag_bytes = StrCat(tag_array[0]);
    for (int i = 1; i < part_tag_size; i++) {
        tag_bytes += ", " + StrCat(tag_array[i]);
    }

    variables_["end_tag"] = StrCat(tag);
    variables_["end_tag_bytes"] = tag_bytes;
  }

  (*variables)["access_level"] = "public";

  (*variables)["property_name"] = property_name();
  (*variables)["type_name"] = type_name();
  (*variables)["extended_type"] = GetClassName(descriptor_->containing_type());
  (*variables)["name"] = name();
  (*variables)["descriptor_name"] = descriptor_->name();
  (*variables)["default_value"] = default_value();
  (*variables)["capitalized_type_name"] = capitalized_type_name();
  (*variables)["number"] = number();
  if (has_default_value() && !SupportsPresenceApi(descriptor_)) {
    (*variables)["name_def_message"] =
      (*variables)["name"] + "_ = " + (*variables)["default_value"];
  } else {
    (*variables)["name_def_message"] = (*variables)["name"] + "_";
  }
  if (SupportsPresenceApi(descriptor_)) {
    (*variables)["has_property_check"] = "Has" + (*variables)["property_name"];
    (*variables)["other_has_property_check"] = "other.Has" + (*variables)["property_name"];
    (*variables)["has_not_property_check"] = "!" + (*variables)["has_property_check"];
    (*variables)["other_has_not_property_check"] = "!" + (*variables)["other_has_property_check"];
    if (presenceIndex_ != -1) {
      std::string hasBitsNumber = StrCat(presenceIndex_ / 32);
      std::string hasBitsMask = StrCat(1 << (presenceIndex_ % 32));
      (*variables)["has_field_check"] = "(_hasBits" + hasBitsNumber + " & " + hasBitsMask + ") != 0";
      (*variables)["set_has_field"] = "_hasBits" + hasBitsNumber + " |= " + hasBitsMask;
      (*variables)["clear_has_field"] = "_hasBits" + hasBitsNumber + " &= ~" + hasBitsMask;
    }
  } else {
    (*variables)["has_property_check"] =
      (*variables)["property_name"] + " != " + (*variables)["default_value"];
    (*variables)["other_has_property_check"] = "other." +
      (*variables)["property_name"] + " != " + (*variables)["default_value"];
  }
}